

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

void duckdb_zstd::ZSTD_CCtxParams_init_internal
               (ZSTD_CCtx_params *cctxParams,ZSTD_parameters *params,int compressionLevel)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ZSTD_strategy ZVar7;
  int iVar8;
  ZSTD_paramSwitch_e ZVar9;
  size_t sVar10;
  
  switchD_01306cb1::default(cctxParams,0,0xd8);
  uVar1 = (params->cParams).chainLog;
  uVar2 = (params->cParams).hashLog;
  uVar3 = (params->cParams).searchLog;
  uVar4 = (params->cParams).searchLog;
  uVar5 = (params->cParams).minMatch;
  uVar6 = (params->cParams).targetLength;
  ZVar7 = (params->cParams).strategy;
  (cctxParams->cParams).windowLog = (params->cParams).windowLog;
  (cctxParams->cParams).chainLog = uVar1;
  (cctxParams->cParams).hashLog = uVar2;
  (cctxParams->cParams).searchLog = uVar3;
  (cctxParams->cParams).searchLog = uVar4;
  (cctxParams->cParams).minMatch = uVar5;
  (cctxParams->cParams).targetLength = uVar6;
  (cctxParams->cParams).strategy = ZVar7;
  iVar8 = (params->fParams).checksumFlag;
  (cctxParams->fParams).contentSizeFlag = (params->fParams).contentSizeFlag;
  (cctxParams->fParams).checksumFlag = iVar8;
  (cctxParams->fParams).noDictIDFlag = (params->fParams).noDictIDFlag;
  cctxParams->compressionLevel = compressionLevel;
  ZVar9 = cctxParams->useRowMatchFinder;
  if ((ZVar9 == ZSTD_ps_auto) &&
     (ZVar9 = ZSTD_ps_disable, 0xfffffffc < (params->cParams).strategy - ZSTD_btlazy2)) {
    ZVar9 = ((params->cParams).windowLog < 0xf) + ZSTD_ps_enable;
  }
  cctxParams->useRowMatchFinder = ZVar9;
  ZVar9 = cctxParams->useBlockSplitter;
  if ((ZVar9 == ZSTD_ps_auto) && (ZVar9 = ZSTD_ps_disable, 6 < (int)(params->cParams).strategy)) {
    ZVar9 = ((params->cParams).windowLog < 0x11) + ZSTD_ps_enable;
  }
  cctxParams->useBlockSplitter = ZVar9;
  ZVar9 = (cctxParams->ldmParams).enableLdm;
  if ((ZVar9 == ZSTD_ps_auto) && (ZVar9 = ZSTD_ps_disable, 6 < (int)(params->cParams).strategy)) {
    ZVar9 = ((params->cParams).windowLog < 0x1b) + ZSTD_ps_enable;
  }
  (cctxParams->ldmParams).enableLdm = ZVar9;
  sVar10 = 0x20000;
  if (cctxParams->maxBlockSize != 0) {
    sVar10 = cctxParams->maxBlockSize;
  }
  cctxParams->maxBlockSize = sVar10;
  ZVar9 = (compressionLevel < 10) + ZSTD_ps_enable;
  if (cctxParams->searchForExternalRepcodes != ZSTD_ps_auto) {
    ZVar9 = cctxParams->searchForExternalRepcodes;
  }
  cctxParams->searchForExternalRepcodes = ZVar9;
  return;
}

Assistant:

static void
ZSTD_CCtxParams_init_internal(ZSTD_CCtx_params* cctxParams,
                        const ZSTD_parameters* params,
                              int compressionLevel)
{
    assert(!ZSTD_checkCParams(params->cParams));
    ZSTD_memset(cctxParams, 0, sizeof(*cctxParams));
    cctxParams->cParams = params->cParams;
    cctxParams->fParams = params->fParams;
    /* Should not matter, as all cParams are presumed properly defined.
     * But, set it for tracing anyway.
     */
    cctxParams->compressionLevel = compressionLevel;
    cctxParams->useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams->useRowMatchFinder, &params->cParams);
    cctxParams->useBlockSplitter = ZSTD_resolveBlockSplitterMode(cctxParams->useBlockSplitter, &params->cParams);
    cctxParams->ldmParams.enableLdm = ZSTD_resolveEnableLdm(cctxParams->ldmParams.enableLdm, &params->cParams);
    cctxParams->validateSequences = ZSTD_resolveExternalSequenceValidation(cctxParams->validateSequences);
    cctxParams->maxBlockSize = ZSTD_resolveMaxBlockSize(cctxParams->maxBlockSize);
    cctxParams->searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(cctxParams->searchForExternalRepcodes, compressionLevel);
    DEBUGLOG(4, "ZSTD_CCtxParams_init_internal: useRowMatchFinder=%d, useBlockSplitter=%d ldm=%d",
                cctxParams->useRowMatchFinder, cctxParams->useBlockSplitter, cctxParams->ldmParams.enableLdm);
}